

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_search.c
# Opt level: O3

int ngram_search_step(ps_search_t *search,int frame_idx)

{
  ps_config_t **pppVar1;
  uint16 uVar2;
  short sVar3;
  s3ssid_t sVar4;
  ps_latnode_t **pppVar5;
  bitvec_t *pbVar6;
  ps_search_t *ppVar7;
  dictword_t *pdVar8;
  hmm_t *phVar9;
  ps_latnode_s *ppVar10;
  bin_mdef_t *pbVar11;
  ps_search_t *ppVar12;
  s3cipid_t *psVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  hmm_t *phVar18;
  int iVar19;
  int32 iVar20;
  uint uVar21;
  int32 iVar22;
  int iVar23;
  uint uVar24;
  int16 *piVar25;
  int32 *piVar26;
  char *pcVar27;
  ps_lattice_t *ppVar28;
  ps_searchfuncs_t *ppVar29;
  int32 **ppiVar30;
  undefined8 *puVar31;
  dict2pid_t *pdVar32;
  ulong uVar33;
  uint *puVar34;
  acmod_t *paVar35;
  undefined4 *puVar36;
  long lVar37;
  uint uVar38;
  int iVar39;
  ngram_search_t *ngs_00;
  dict_t *pdVar40;
  hmm_t *phVar41;
  long lVar42;
  uint uVar43;
  int iVar44;
  uint *puVar45;
  long *plVar46;
  ngram_search_t *ngs;
  ps_latnode_t *ppVar47;
  long lVar48;
  ps_searchfuncs_t *ppVar49;
  long lVar50;
  int iVar51;
  int iVar52;
  chan_t *pcVar53;
  chan_s *pcVar54;
  int *piVar55;
  hmm_t *phVar56;
  ulong uVar57;
  bptbl_t *pbVar58;
  xwdssid_t *pxVar59;
  acmod_t *paVar60;
  ps_latlink_t *ppVar61;
  long lVar62;
  chan_s *h;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  ps_searchfuncs_t *ppStack_490;
  undefined8 *puStack_480;
  uint uStack_46c;
  dict2pid_t *pdStack_468;
  ps_searchfuncs_t *ppStack_460;
  ps_searchfuncs_t *ppStack_458;
  ulong uStack_450;
  uint *puStack_448;
  ulong uStack_440;
  int32 aiStack_438 [226];
  code *pcStack_b0;
  ngram_search_t *pnStack_a8;
  uint uStack_9c;
  int16 *piStack_98;
  int iStack_8c;
  dict_t *pdStack_88;
  int iStack_80;
  float32 fStack_7c;
  int32 *piStack_78;
  ulong uStack_70;
  int32 *piStack_68;
  int *piStack_60;
  ulong uStack_58;
  int iStack_4c;
  dict2pid_t *pdStack_48;
  ulong uStack_40;
  int32 iStack_34;
  
  if (*(char *)&search[1].name == '\0') {
    if (*(char *)((long)&search[1].name + 1) == '\0') {
      return -1;
    }
    pnStack_a8 = (ngram_search_t *)search;
    uStack_9c = frame_idx;
    if (search->acmod->compallsen == '\0') {
      pcStack_b0 = (code *)0x13c231;
      acmod_clear_active(search->acmod);
      iVar19 = pnStack_a8->n_active_word[frame_idx & 1U];
      if (0 < iVar19) {
        piVar55 = pnStack_a8->active_word_list[frame_idx & 1U];
        iVar51 = 0;
        do {
          pcVar53 = pnStack_a8->word_chan[*piVar55];
          do {
            if ((pcVar53->hmm).frame == frame_idx) {
              pcStack_b0 = (code *)0x13c27f;
              acmod_activate_hmm((pnStack_a8->base).acmod,&pcVar53->hmm);
            }
            pcVar53 = pcVar53->next;
          } while (pcVar53 != (chan_s *)0x0);
          piVar55 = piVar55 + 1;
          iVar51 = iVar51 + 1;
        } while (iVar51 != iVar19);
      }
    }
    ngs_00 = pnStack_a8;
    pcStack_b0 = (code *)0x13c2a9;
    piVar25 = acmod_score((pnStack_a8->base).acmod,(int *)&uStack_9c);
    piVar26 = &(ngs_00->st).n_senone_active_utt;
    *piVar26 = *piVar26 + ((ngs_00->base).acmod)->n_senone_active;
    pcStack_b0 = (code *)0x13c2c4;
    ngram_search_mark_bptable(ngs_00,uStack_9c);
    iVar19 = 0;
    if (-0x20000000 < ngs_00->best_score) {
      if (ngs_00->best_score + ngs_00->beam * 2 < -0x20000000) {
        iVar51 = 0;
        pcStack_b0 = (code *)0x13c318;
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
                ,0x345,"Renormalizing Scores at frame %d, best score %d\n",(ulong)uStack_9c);
        uVar43 = uStack_9c;
        iVar19 = ngs_00->n_active_word[uStack_9c & 1];
        if (0 < iVar19) {
          iVar22 = ngs_00->best_score;
          piVar55 = ngs_00->active_word_list[uStack_9c & 1];
          piStack_98 = piVar25;
          do {
            pcVar53 = pnStack_a8->word_chan[*piVar55];
            do {
              if ((pcVar53->hmm).frame == uVar43) {
                pcStack_b0 = (code *)0x13c36e;
                hmm_normalize(&pcVar53->hmm,iVar22);
              }
              pcVar53 = pcVar53->next;
            } while (pcVar53 != (chan_s *)0x0);
            piVar55 = piVar55 + 1;
            iVar51 = iVar51 + 1;
            ngs_00 = pnStack_a8;
            piVar25 = piStack_98;
          } while (iVar51 != iVar19);
        }
        ngs_00->renormalized = 1;
      }
      uVar43 = uStack_9c;
      ngs_00->best_score = -0x20000000;
      ngs_00->hmmctx->senscore = piVar25;
      uVar33 = (ulong)(uStack_9c & 1);
      piStack_98._0_4_ = ngs_00->n_active_word[uVar33];
      ppiVar30 = ngs_00->active_word_list;
      piVar55 = ppiVar30[uVar33];
      piVar26 = &(ngs_00->st).n_fwdflat_words;
      *piVar26 = *piVar26 + (int)piStack_98;
      iVar22 = -0x20000000;
      iVar19 = -0x20000000;
      if (0 < (int)piStack_98) {
        iVar51 = 0;
LAB_0013c3df:
        iVar52 = *piVar55;
        pcVar54 = ngs_00->word_chan[iVar52];
        ngs_00 = pnStack_a8;
        if ((pcVar54->hmm).frame != uVar43) goto LAB_0013c422;
        pcStack_b0 = (code *)0x13c3ff;
        iVar20 = hmm_vit_eval(&pcVar54->hmm);
        ngs_00 = pnStack_a8;
        if ((iVar19 < iVar20) && (iVar22 = iVar19, iVar52 != (pnStack_a8->base).finish_wid)) {
          iVar19 = iVar20;
          iVar22 = iVar20;
        }
        do {
          piVar26 = &(ngs_00->st).n_fwdflat_chan;
          *piVar26 = *piVar26 + 1;
LAB_0013c422:
          do {
            pcVar54 = pcVar54->next;
            if (pcVar54 == (chan_s *)0x0) {
              piVar55 = piVar55 + 1;
              iVar51 = iVar51 + 1;
              if (iVar51 != (int)piStack_98) goto LAB_0013c3df;
              ppiVar30 = ngs_00->active_word_list;
              uVar33 = (ulong)(uStack_9c & 1);
              goto LAB_0013c460;
            }
          } while ((pcVar54->hmm).frame != uVar43);
          pcStack_b0 = (code *)0x13c439;
          iVar20 = hmm_vit_eval(&pcVar54->hmm);
          bVar14 = iVar19 < iVar20;
          iVar19 = iVar22;
          if (bVar14) {
            iVar19 = iVar20;
            iVar22 = iVar20;
          }
        } while( true );
      }
LAB_0013c460:
      uVar43 = uStack_9c;
      ngs_00->best_score = iVar19;
      iVar51 = ngs_00->n_active_word[uVar33];
      piVar55 = ppiVar30[uVar33];
      iVar52 = (ngs_00->base).n_words;
      iVar19 = iVar52 + 0x1f;
      iVar52 = iVar52 + 0x3e;
      if (-1 < iVar19) {
        iVar52 = iVar19;
      }
      iVar19 = 0;
      pcStack_b0 = (code *)0x13c49a;
      memset(ngs_00->word_active,0,(long)(iVar52 >> 5) << 2);
      iStack_8c = ngs_00->pip;
      piStack_98 = (int16 *)CONCAT44(piStack_98._4_4_,ngs_00->fwdflatbeam + ngs_00->best_score);
      uStack_70 = CONCAT44(uStack_70._4_4_,iVar51);
      if (0 < iVar51) {
        iVar51 = uVar43 + 1;
        piStack_68 = (int32 *)CONCAT44(piStack_68._4_4_,ngs_00->best_score + ngs_00->fwdflatwbeam);
        do {
          iVar52 = *piVar55;
          piStack_78 = (int32 *)(long)iVar52;
          pcVar53 = pnStack_a8->word_chan[(long)piStack_78];
          fStack_7c = (float32)iVar19;
          if (((pcVar53->hmm).frame == uVar43) && ((int)piStack_98 < (pcVar53->hmm).bestscore)) {
            (pcVar53->hmm).frame = iVar51;
            iVar19 = iVar52 + 0x1f;
            if (-1 < iVar52) {
              iVar19 = iVar52;
            }
            pnStack_a8->word_active[iVar19 >> 5] =
                 pnStack_a8->word_active[iVar19 >> 5] | 1 << ((byte)iVar52 & 0x1f);
            iVar19 = (pcVar53->hmm).out_score;
            pcVar54 = pcVar53->next;
            iVar44 = ((pnStack_a8->base).dict)->word[(long)piStack_78].pronlen;
            if (pcVar54 == (chan_s *)0x0) {
              if (iVar44 != 1) {
                pcStack_b0 = ngram_fwdflat_finish;
                __assert_fail("dict_is_single_phone(ps_search_dict(ngs), w)",
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
                              ,0x21c,"void fwdflat_prune_chan(ngram_search_t *, int)");
              }
              if ((int)piStack_68 < iVar19) {
                pcStack_b0 = (code *)0x13c5bf;
                ngram_search_save_bp(pnStack_a8,uVar43,iVar52,iVar19,(pcVar53->hmm).out_history,0);
              }
            }
            else {
              if (iVar44 == 1) {
                pcStack_b0 = (code *)0x13cd6f;
                __assert_fail("!dict_is_single_phone(ps_search_dict(ngs), w)",
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
                              ,0x202,"void fwdflat_prune_chan(ngram_search_t *, int)");
              }
              iVar19 = iVar19 + iStack_8c;
              if ((int)piStack_98 < iVar19) {
                if ((pcVar54->info).penult_phn_wid < 0) {
                  if (((pcVar54->hmm).frame < (int)uVar43) || ((pcVar54->hmm).score[0] < iVar19)) {
                    pcStack_b0 = (code *)0x13c5dd;
                    hmm_enter(&pcVar54->hmm,iVar19,(pcVar53->hmm).out_history,iVar51);
                  }
                }
                else {
                  do {
                    if (((pcVar54->hmm).frame < (int)uVar43) || ((pcVar54->hmm).score[0] < iVar19))
                    {
                      pcStack_b0 = (code *)0x13c589;
                      hmm_enter(&pcVar54->hmm,iVar19,(pcVar53->hmm).out_history,iVar51);
                    }
                    pcVar54 = pcVar54->next;
                  } while (pcVar54 != (chan_s *)0x0);
                }
              }
            }
          }
          pcVar54 = pcVar53->next;
          piStack_60 = piVar55;
          if (pcVar54 != (chan_s *)0x0) {
            pdStack_88 = (dict_t *)CONCAT44(pdStack_88._4_4_,1 << ((byte)piStack_78 & 0x1f));
            iVar19 = (int)piStack_78;
            iVar52 = iVar19 + 0x1f;
            if (-1 < iVar19) {
              iVar52 = iVar19;
            }
            do {
              iVar19 = (pcVar54->hmm).frame;
              if ((int)uVar43 <= iVar19) {
                if ((int)piStack_98 < (pcVar54->hmm).bestscore) {
                  (pcVar54->hmm).frame = iVar51;
                  pnStack_a8->word_active[iVar52 >> 5] =
                       pnStack_a8->word_active[iVar52 >> 5] | (uint)pdStack_88;
                  iVar19 = (pcVar54->hmm).out_score;
                  if ((pcVar54->info).penult_phn_wid < 0) {
                    iVar19 = iVar19 + iStack_8c;
                    if ((int)piStack_98 < iVar19) {
                      h = pcVar54->next;
                      if ((h->info).penult_phn_wid < 0) {
                        if (((h->hmm).frame < (int)uVar43) || ((h->hmm).score[0] < iVar19)) {
                          pcStack_b0 = (code *)0x13c6ed;
                          hmm_enter(&h->hmm,iVar19,(pcVar54->hmm).out_history,iVar51);
                        }
                      }
                      else {
                        do {
                          if (((h->hmm).frame < (int)uVar43) || ((h->hmm).score[0] < iVar19)) {
                            pcStack_b0 = (code *)0x13c6bd;
                            hmm_enter(&h->hmm,iVar19,(pcVar54->hmm).out_history,iVar51);
                          }
                          h = h->next;
                        } while (h != (chan_s *)0x0);
                      }
                    }
                  }
                  else if ((int)piStack_68 < iVar19) {
                    pcStack_b0 = (code *)0x13c677;
                    ngram_search_save_bp
                              (pnStack_a8,uVar43,(int32)piStack_78,iVar19,(pcVar54->hmm).out_history
                               ,(pcVar54->info).penult_phn_wid);
                  }
                }
                else if (iVar19 != iVar51) {
                  pcStack_b0 = (code *)0x13c685;
                  hmm_clear_scores(&pcVar54->hmm);
                }
              }
              pcVar54 = pcVar54->next;
            } while (pcVar54 != (chan_s *)0x0);
          }
          piVar55 = piStack_60 + 1;
          iVar19 = (int)fStack_7c + 1;
        } while (iVar19 != (int)uStack_70);
        iStack_8c = pnStack_a8->pip;
        piStack_98 = (int16 *)CONCAT44(piStack_98._4_4_,
                                       pnStack_a8->fwdflatbeam + pnStack_a8->best_score);
        ngs_00 = pnStack_a8;
      }
      uVar43 = uStack_9c;
      piVar55 = (int *)(long)(int)uStack_9c;
      uStack_58 = (ulong)uStack_9c;
      pdStack_88 = (ngs_00->base).dict;
      pdStack_48 = (ngs_00->base).d2p;
      fStack_7c = ngs_00->fwdflat_fwdtree_lw_ratio;
      if (ngs_00->fwdtree != '\0') {
        uVar38 = uStack_9c - ngs_00->max_sf_win;
        lVar37 = 0;
        if ((int)uVar38 < 1) {
          uVar38 = 0;
        }
        uVar21 = ngs_00->max_sf_win + uStack_9c;
        iVar19 = (ngs_00->base).n_words;
        uVar24 = ngs_00->n_frame;
        if ((int)uVar21 < ngs_00->n_frame) {
          uVar24 = uVar21;
        }
        iVar51 = iVar19 + 0x1f;
        iVar19 = iVar19 + 0x3e;
        if (-1 < iVar51) {
          iVar19 = iVar51;
        }
        pcStack_b0 = (code *)0x13c7b2;
        memset(ngs_00->expand_word_flag,0,(long)(iVar19 >> 5) << 2);
        ngs_00->n_expand_words = 0;
        if ((int)uVar38 < (int)uVar24) {
          pppVar5 = ngs_00->frm_wordlist;
          uVar33 = (ulong)uVar38;
          do {
            ppVar47 = pppVar5[uVar33];
            if (ppVar47 != (ps_latnode_t *)0x0) {
              pbVar6 = ngs_00->expand_word_flag;
              do {
                uVar38 = ppVar47->wid;
                uVar21 = uVar38 + 0x1f;
                if (-1 < (int)uVar38) {
                  uVar21 = uVar38;
                }
                if ((pbVar6[(int)uVar21 >> 5] >> (uVar38 & 0x1f) & 1) == 0) {
                  iVar19 = ngs_00->n_expand_words;
                  ngs_00->n_expand_words = iVar19 + 1;
                  ngs_00->expand_word_list[iVar19] = uVar38;
                  iVar19 = ppVar47->wid;
                  iVar51 = iVar19 + 0x1f;
                  if (-1 < iVar19) {
                    iVar51 = iVar19;
                  }
                  puVar34 = pbVar6 + (iVar51 >> 5);
                  *puVar34 = *puVar34 | 1 << ((byte)iVar19 & 0x1f);
                }
                ppVar47 = ppVar47->next;
              } while (ppVar47 != (ps_latnode_s *)0x0);
            }
            uVar33 = uVar33 + 1;
          } while (uVar33 != uVar24);
          lVar37 = (long)ngs_00->n_expand_words;
        }
        ngs_00->expand_word_list[lVar37] = -1;
      }
      iStack_80 = uVar43 + 1;
      piVar26 = &(ngs_00->st).n_fwdflat_word_transition;
      *piVar26 = *piVar26 + ngs_00->n_expand_words;
      uVar33 = (ulong)ngs_00->bp_table_idx[(long)piVar55];
      if (ngs_00->bp_table_idx[(long)piVar55] < ngs_00->bpidx) {
        uVar57 = 0;
        iVar19 = -0x20000000;
        piStack_60 = piVar55;
        do {
          pbVar58 = ngs_00->bp_table;
          ngs_00->word_lat_idx[pbVar58[uVar33].wid] = -1;
          if (pbVar58[uVar33].wid != (ngs_00->base).finish_wid) {
            if ((long)pbVar58[uVar33].last2_phone == -1) {
              pxVar59 = (xwdssid_t *)0x0;
            }
            else {
              pxVar59 = pdStack_48->rssid[pbVar58[uVar33].last_phone] + pbVar58[uVar33].last2_phone;
            }
            piStack_68 = ngs_00->bscore_stack + pbVar58[uVar33].s_idx;
            uVar43 = *ngs_00->expand_word_list;
            uStack_70 = uVar33;
            iStack_4c = iVar19;
            uStack_40 = uVar57;
            if (-1 < (int)uVar43) {
              piStack_78 = &pbVar58[uVar33].score;
              lVar37 = 4;
              do {
                piVar26 = piStack_78;
                if (pxVar59 != (xwdssid_t *)0x0) {
                  piVar26 = piStack_68 + pxVar59->cimap[*pdStack_88->word[uVar43].ciphone];
                }
                iVar19 = *piVar26;
                if (iVar19 != -0x20000000) {
                  pcStack_b0 = (code *)0x13c9b9;
                  iVar22 = ngram_tg_score(pnStack_a8->lmset,pdStack_88->word[uVar43].basewid,
                                          pbVar58[uVar33].real_wid,pbVar58[uVar33].prev_real_wid,
                                          &iStack_34);
                  iVar19 = (int)((float)iVar19 + (float)(iVar22 >> 10) * (float)fStack_7c) +
                           iStack_8c;
                  if (((int)piStack_98 < iVar19) &&
                     ((pcVar53 = pnStack_a8->word_chan[uVar43],
                      (pcVar53->hmm).frame < (int)piStack_60 || ((pcVar53->hmm).score[0] < iVar19)))
                     ) {
                    pcStack_b0 = (code *)0x13ca16;
                    hmm_enter(&pcVar53->hmm,iVar19,(int32)uStack_70,iStack_80);
                    uVar2 = pdStack_48->ldiph_lc[(short)pcVar53->ciphone]
                            [*(short *)((long)&pcVar53->ciphone + 2)]
                            [pdStack_88->word[pbVar58[uVar33].wid].ciphone
                             [(long)pdStack_88->word[pbVar58[uVar33].wid].pronlen + -1]];
                    (pcVar53->hmm).senid[0] = uVar2;
                    if (uVar2 == 0xffff) {
                      pcStack_b0 = (code *)0x13cd50;
                      __assert_fail("IS_S3SSID(hmm_mpx_ssid(&rhmm->hmm, 0))",
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
                                    ,0x2d0,"void fwdflat_word_transition(ngram_search_t *, int)");
                    }
                    pnStack_a8->word_active[uVar43 >> 5] =
                         pnStack_a8->word_active[uVar43 >> 5] | 1 << ((byte)uVar43 & 0x1f);
                  }
                }
                uVar43 = *(uint *)((long)pnStack_a8->expand_word_list + lVar37);
                lVar37 = lVar37 + 4;
                ngs_00 = pnStack_a8;
              } while (-1 < (int)uVar43);
            }
            if (pxVar59 == (xwdssid_t *)0x0) {
              piVar26 = &pbVar58[uVar33].score;
            }
            else {
              piVar26 = piStack_68 + pxVar59->cimap[((ngs_00->base).acmod)->mdef->sil];
            }
            iVar51 = *piVar26;
            uVar57 = uStack_40;
            if (iStack_4c < iVar51) {
              uVar57 = uStack_70;
            }
            uVar57 = uVar57 & 0xffffffff;
            uVar33 = uStack_70;
            piVar55 = piStack_60;
            iVar19 = iStack_4c;
            if (iStack_4c < iVar51) {
              iVar19 = iVar51;
            }
          }
          uVar43 = (uint)piVar55;
          uVar33 = uVar33 + 1;
        } while ((long)uVar33 < (long)ngs_00->bpidx);
      }
      else {
        iVar19 = -0x20000000;
        uVar57 = 0;
      }
      iVar19 = iVar19 + iStack_8c;
      iVar51 = ngs_00->silpen + iVar19;
      if (-0x20000000 < iVar51 && (int)piStack_98 < iVar51) {
        iVar52 = (ngs_00->base).silence_wid;
        pcVar53 = ngs_00->word_chan[iVar52];
        if (((pcVar53->hmm).frame < (int)uStack_58) || ((pcVar53->hmm).score[0] < iVar51)) {
          pcStack_b0 = (code *)0x13cb53;
          hmm_enter(&pcVar53->hmm,iVar51,(int32)uVar57,iStack_80);
          iVar51 = iVar52 + 0x1f;
          if (-1 < iVar52) {
            iVar51 = iVar52;
          }
          ngs_00->word_active[iVar51 >> 5] =
               ngs_00->word_active[iVar51 >> 5] | 1 << ((byte)iVar52 & 0x1f);
        }
      }
      iVar19 = iVar19 + ngs_00->fillpen;
      uVar38 = (uint)uStack_58;
      if (-0x20000000 < iVar19 && (int)piStack_98 < iVar19) {
        iVar51 = pdStack_88->filler_start;
        iVar52 = pdStack_88->filler_end;
        if (iVar51 <= iVar52) {
          lVar37 = (long)iVar51 + -1;
          uVar33 = uStack_58;
          do {
            if (((iVar51 != (ngs_00->base).silence_wid) &&
                (pcVar53 = ngs_00->word_chan[lVar37 + 1], pcVar53 != (chan_t *)0x0)) &&
               (((pcVar53->hmm).frame < (int)uVar33 || ((pcVar53->hmm).score[0] < iVar19)))) {
              pcStack_b0 = (code *)0x13cbe6;
              hmm_enter(&pcVar53->hmm,iVar19,(int32)uVar57,iStack_80);
              iVar52 = iVar51 + 0x1f;
              if (-1 < iVar51) {
                iVar52 = iVar51;
              }
              ngs_00->word_active[iVar52 >> 5] =
                   ngs_00->word_active[iVar52 >> 5] | 1 << ((byte)iVar51 & 0x1f);
              iVar52 = pdStack_88->filler_end;
              uVar33 = uStack_58;
            }
            uVar38 = (uint)uVar33;
            lVar37 = lVar37 + 1;
            iVar51 = iVar51 + 1;
          } while (lVar37 < iVar52);
        }
      }
      iVar19 = ngs_00->n_active_word[uVar38 & 1];
      ppiVar30 = ngs_00->active_word_list;
      if (0 < iVar19) {
        piVar26 = ppiVar30[uVar38 & 1];
        lVar37 = 0;
        do {
          if ((ngs_00->word_chan[piVar26[lVar37]]->hmm).frame == uVar43) {
            pcStack_b0 = (code *)0x13cc5e;
            hmm_clear_scores(&ngs_00->word_chan[piVar26[lVar37]]->hmm);
          }
          lVar37 = lVar37 + 1;
        } while (iVar19 != (int)lVar37);
        ppiVar30 = ngs_00->active_word_list;
      }
      puVar34 = (uint *)ppiVar30[~uStack_9c & 1];
      puVar45 = (uint *)ngs_00->fwdflat_wordlist;
      uVar43 = *puVar45;
      if ((int)uVar43 < 0) {
        iVar19 = 0;
      }
      else {
        pbVar6 = ngs_00->word_active;
        iVar19 = 0;
        do {
          puVar45 = puVar45 + 1;
          if (((pbVar6[uVar43 >> 5] >> (uVar43 & 0x1f) & 1) != 0) &&
             ((int)uVar43 < (ngs_00->base).start_wid)) {
            *puVar34 = uVar43;
            puVar34 = puVar34 + 1;
            iVar19 = iVar19 + 1;
          }
          uVar43 = *puVar45;
        } while (-1 < (int)uVar43);
      }
      iVar51 = (ngs_00->base).n_words;
      uVar43 = (ngs_00->base).start_wid;
      if ((int)uVar43 < iVar51) {
        pbVar6 = ngs_00->word_active;
        do {
          uVar38 = uVar43 + 0x1f;
          if (-1 < (int)uVar43) {
            uVar38 = uVar43;
          }
          if ((pbVar6[(int)uVar38 >> 5] >> (uVar43 & 0x1f) & 1) != 0) {
            *puVar34 = uVar43;
            puVar34 = puVar34 + 1;
            iVar19 = iVar19 + 1;
            iVar51 = (ngs_00->base).n_words;
          }
          uVar43 = uVar43 + 1;
        } while ((int)uVar43 < iVar51);
      }
      if (ngs_00->fwdtree == '\0') {
        ngs_00->n_frame = ngs_00->n_frame + 1;
      }
      ngs_00->n_active_word[~uStack_9c & 1] = iVar19;
      iVar19 = 1;
    }
    return iVar19;
  }
  uStack_46c = frame_idx;
  if (search->acmod->compallsen == '\0') {
    acmod_clear_active(search->acmod);
    iVar19 = *(int *)((long)&search[1].d2p + 4);
    if (0 < iVar19) {
      phVar41 = (hmm_t *)search[1].dict;
      iVar19 = iVar19 + 1;
      do {
        if (phVar41->frame == frame_idx) {
          acmod_activate_hmm(search->acmod,phVar41);
        }
        phVar41 = (hmm_t *)(phVar41[1].score + 4);
        iVar19 = iVar19 + -1;
      } while (1 < iVar19);
    }
    uVar33 = (ulong)(frame_idx & 1);
    iVar19 = *(int *)((long)&search[2].name + uVar33 * 4);
    if (0 < iVar19) {
      puVar31 = *(undefined8 **)(search[2].type + uVar33 * 8);
      uVar43 = iVar19 + 1;
      do {
        phVar41 = (hmm_t *)*puVar31;
        puVar31 = puVar31 + 1;
        acmod_activate_hmm(search->acmod,phVar41);
        uVar43 = uVar43 - 1;
      } while (1 < uVar43);
    }
    iVar19 = *(int *)((long)&search[2].config + uVar33 * 4);
    if (0 < iVar19) {
      ppVar29 = (&(search[2].pls)->vt)[uVar33];
      do {
        for (phVar41 = (hmm_t *)(&(search[1].last_link)->from)[*(int *)&ppVar29->start];
            phVar41 != (hmm_t *)0x0; phVar41 = (hmm_t *)phVar41[1].ctx) {
          acmod_activate_hmm(search->acmod,phVar41);
        }
        ppVar29 = (ps_searchfuncs_t *)((long)&ppVar29->start + 4);
        bVar14 = 1 < iVar19;
        iVar19 = iVar19 + -1;
      } while (bVar14);
    }
    iVar19 = *(int *)&search[2].vt;
    if (0 < iVar19) {
      lVar37 = 0;
      do {
        phVar41 = (hmm_t *)(&(search[1].last_link)->from)
                           [*(int *)(*(long *)&search[1].finish_wid + lVar37 * 4)];
        if (phVar41->frame == frame_idx) {
          acmod_activate_hmm(search->acmod,phVar41);
          iVar19 = *(int *)&search[2].vt;
        }
        lVar37 = lVar37 + 1;
      } while (lVar37 < iVar19);
    }
  }
  piVar25 = acmod_score(search->acmod,(int *)&uStack_46c);
  iVar19 = 0;
  if (piVar25 != (int16 *)0x0) {
    *(int *)&search[4].pls = *(int *)&search[4].pls + search->acmod->n_senone_active;
    ngram_search_mark_bptable((ngram_search_t *)search,uStack_46c);
    iVar19 = 0;
    if (-0x20000000 < *(int *)&search[3].last_link) {
      if (*(int *)&search[3].last_link + search[5].n_words * 2 < -0x20000000) {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                ,0x5c5,"Renormalizing Scores at frame %d, best score %d\n",(ulong)uStack_46c);
        uVar43 = uStack_46c;
        iVar19 = *(int *)((long)&search[1].d2p + 4);
        iVar22 = *(int32 *)&search[3].last_link;
        if (0 < iVar19) {
          phVar41 = (hmm_t *)search[1].dict;
          iVar19 = iVar19 + 1;
          do {
            if (phVar41->frame == uVar43) {
              hmm_normalize(phVar41,iVar22);
            }
            phVar41 = (hmm_t *)(phVar41[1].score + 4);
            iVar19 = iVar19 + -1;
          } while (1 < iVar19);
        }
        uVar33 = (ulong)(uVar43 & 1);
        iVar19 = *(int *)((long)&search[2].name + uVar33 * 4);
        if (0 < iVar19) {
          puVar31 = *(undefined8 **)(search[2].type + uVar33 * 8);
          uVar38 = iVar19 + 1;
          do {
            phVar41 = (hmm_t *)*puVar31;
            puVar31 = puVar31 + 1;
            hmm_normalize(phVar41,iVar22);
            uVar38 = uVar38 - 1;
          } while (1 < uVar38);
        }
        iVar19 = *(int *)((long)&search[2].config + uVar33 * 4);
        if (0 < iVar19) {
          ppVar29 = (&(search[2].pls)->vt)[uVar33];
          do {
            for (phVar41 = (hmm_t *)(&(search[1].last_link)->from)[*(int *)&ppVar29->start];
                phVar41 != (hmm_t *)0x0; phVar41 = (hmm_t *)phVar41[1].ctx) {
              hmm_normalize(phVar41,iVar22);
            }
            ppVar29 = (ps_searchfuncs_t *)((long)&ppVar29->start + 4);
            bVar14 = 1 < iVar19;
            iVar19 = iVar19 + -1;
          } while (bVar14);
        }
        iVar19 = *(int *)&search[2].vt;
        if (0 < iVar19) {
          lVar37 = 0;
          do {
            phVar41 = (hmm_t *)(&(search[1].last_link)->from)
                               [*(int *)(*(long *)&search[1].finish_wid + lVar37 * 4)];
            if (phVar41->frame == uVar43) {
              hmm_normalize(phVar41,iVar22);
              iVar19 = *(int *)&search[2].vt;
            }
            lVar37 = lVar37 + 1;
          } while (lVar37 < iVar19);
        }
        search[3].post = 1;
      }
      uVar43 = uStack_46c;
      *(int16 **)(search[1].type + 0x10) = piVar25;
      iVar19 = *(int *)((long)&search[1].d2p + 4);
      iVar52 = -0x20000000;
      iVar51 = -0x20000000;
      if (0 < iVar19) {
        phVar41 = (hmm_t *)search[1].dict;
        iVar19 = iVar19 + 1;
        do {
          if (phVar41->frame == uVar43) {
            iVar22 = hmm_vit_eval(phVar41);
            if (iVar51 < iVar22) {
              iVar51 = iVar22;
            }
            search[3].finish_wid = search[3].finish_wid + 1;
          }
          phVar41 = (hmm_t *)(phVar41[1].score + 4);
          iVar19 = iVar19 + -1;
        } while (1 < iVar19);
      }
      *(int *)&search[3].last_link = iVar51;
      uVar33 = (ulong)(uVar43 & 1);
      iVar19 = *(int *)((long)&search[2].name + uVar33 * 4);
      puVar31 = *(undefined8 **)(search[2].type + uVar33 * 8);
      *(int *)&search[3].field_0x6c = *(int *)&search[3].field_0x6c + iVar19;
      if (0 < iVar19) {
        iVar19 = iVar19 + 1;
        iVar52 = -0x20000000;
        do {
          phVar41 = (hmm_t *)*puVar31;
          iVar22 = hmm_vit_eval(phVar41);
          if (phVar41->frame != uVar43) {
            __assert_fail("hmm_frame(&hmm->hmm) == frame_idx",
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                          ,0x27c,"int32 eval_nonroot_chan(ngram_search_t *, int)");
          }
          puVar31 = puVar31 + 1;
          if (iVar52 < iVar22) {
            iVar52 = iVar22;
          }
          iVar19 = iVar19 + -1;
        } while (1 < iVar19);
        iVar51 = *(int *)&search[3].last_link;
      }
      if (iVar51 < iVar52) {
        *(int *)&search[3].last_link = iVar52;
      }
      iVar19 = *(int *)((long)&search[2].config + uVar33 * 4);
      if (iVar19 < 1) {
        iVar51 = -0x20000000;
        iVar52 = 0;
      }
      else {
        ppStack_490 = (&(search[2].pls)->vt)[uVar33];
        iVar51 = -0x20000000;
        iVar52 = 0;
        do {
          uVar38 = *(uint *)&ppStack_490->start;
          uVar24 = uVar38 + 0x1f;
          if (-1 < (long)(int)uVar38) {
            uVar24 = uVar38;
          }
          uVar21 = *(uint *)(*(long *)&search[1].post + (long)((int)uVar24 >> 5) * 4);
          if ((uVar21 >> (uVar38 & 0x1f) & 1) == 0) {
            __assert_fail("bitvec_is_set(ngs->word_active, w)",
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                          ,0x291,"int32 eval_word_chan(ngram_search_t *, int)");
          }
          *(uint *)(*(long *)&search[1].post + (long)((int)uVar24 >> 5) * 4) =
               uVar21 & ~(uint)(1L << ((byte)uVar38 & 0x1f));
          phVar41 = (hmm_t *)(&(search[1].last_link)->from)[(int)uVar38];
          if (phVar41 == (hmm_t *)0x0) {
            __assert_fail("ngs->word_chan[w] != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                          ,0x293,"int32 eval_word_chan(ngram_search_t *, int)");
          }
          ppStack_490 = (ps_searchfuncs_t *)((long)&ppStack_490->start + 4);
          do {
            if (phVar41->frame != uVar43) {
              __assert_fail("hmm_frame(&hmm->hmm) == frame_idx",
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                            ,0x298,"int32 eval_word_chan(ngram_search_t *, int)");
            }
            iVar22 = hmm_vit_eval(phVar41);
            if (iVar51 < iVar22) {
              iVar51 = iVar22;
            }
            iVar52 = iVar52 + 1;
            phVar41 = (hmm_t *)phVar41[1].ctx;
          } while (phVar41 != (hmm_t *)0x0);
          bVar14 = 1 < iVar19;
          iVar19 = iVar19 + -1;
        } while (bVar14);
      }
      iVar19 = *(int *)&search[2].vt;
      if (iVar19 < 1) {
        iVar44 = 0;
      }
      else {
        lVar37 = 0;
        iVar44 = 0;
        do {
          iVar39 = *(int *)(*(long *)&search[1].finish_wid + lVar37 * 4);
          phVar41 = (hmm_t *)(&(search[1].last_link)->from)[iVar39];
          if ((int)uVar43 <= phVar41->frame) {
            iVar22 = hmm_vit_eval(phVar41);
            if ((iVar51 < iVar22) && (iVar39 != search->finish_wid)) {
              iVar51 = iVar22;
            }
            iVar44 = iVar44 + 1;
            iVar19 = *(int *)&search[2].vt;
          }
          lVar37 = lVar37 + 1;
        } while (lVar37 < iVar19);
      }
      uVar43 = uStack_46c;
      *(int *)&search[4].vt = *(int *)&search[4].vt + iVar52 + iVar44;
      iVar52 = iVar52 + iVar44 + *(int *)&search[3].field_0x6c;
      *(int *)&search[3].field_0x6c = iVar52;
      piVar55 = (int *)((long)&search[4].vt + 4);
      *piVar55 = *piVar55 + iVar44 + *(int *)((long)&search[2].config + uVar33 * 4);
      iVar19 = *(int *)&search[3].last_link;
      if (*(int *)&search[3].last_link < iVar51) {
        *(int *)&search[3].last_link = iVar51;
        iVar19 = iVar51;
      }
      *(int *)((long)&search[3].last_link + 4) = iVar51;
      *(undefined4 *)&search[2].dict = 0;
      iVar51 = search[5].n_words;
      iVar44 = *(int *)((long)&search[6].config + 4);
      search[5].start_wid = iVar51;
      if (iVar44 == -1) {
        iVar39 = *(int *)((long)&search[1].d2p + 4);
      }
      else {
        iVar39 = *(int *)((long)&search[1].d2p + 4);
        if (iVar44 < iVar52 + search[3].finish_wid) {
          iVar52 = iVar51 + 0xff;
          if (-1 < iVar51) {
            iVar52 = iVar51;
          }
          iVar51 = -(iVar52 >> 8);
          memset(aiStack_438,0,0x400);
          if (0 < iVar39) {
            piVar55 = (int *)&search[1].dict[1].field_0x4;
            iVar52 = iVar39;
            do {
              iVar23 = (iVar19 - *piVar55) / iVar51;
              if (0xfe < iVar23) {
                iVar23 = 0xff;
              }
              aiStack_438[iVar23] = aiStack_438[iVar23] + 1;
              piVar55 = piVar55 + 0x1c;
              iVar52 = iVar52 + -1;
            } while (iVar52 != 0);
          }
          iVar52 = *(int *)((long)&search[2].name + (ulong)(uVar43 & 1) * 4);
          if (0 < iVar52) {
            plVar46 = *(long **)(search[2].type + (ulong)(uVar43 & 1) * 8);
            uVar38 = iVar52 + 1;
            do {
              iVar52 = (iVar19 - *(int *)(*plVar46 + 0x44)) / iVar51;
              if (0xfe < iVar52) {
                iVar52 = 0xff;
              }
              aiStack_438[iVar52] = aiStack_438[iVar52] + 1;
              plVar46 = plVar46 + 1;
              uVar38 = uVar38 - 1;
            } while (1 < uVar38);
          }
          lVar37 = 0;
          iVar52 = 0;
          do {
            iVar52 = iVar52 + aiStack_438[lVar37];
            if (iVar44 < iVar52) goto LAB_0013e518;
            lVar37 = lVar37 + 1;
          } while (lVar37 != 0x100);
          lVar37 = 0x100;
LAB_0013e518:
          iVar51 = -(iVar51 * (int)lVar37);
          search[5].start_wid = iVar51;
        }
      }
      uVar38 = uVar43 + 1;
      ppVar29 = (ps_searchfuncs_t *)(ulong)(uint)(iVar51 + iVar19);
      iVar51 = search[5].silence_wid + iVar19;
      iVar19 = iVar19 + *(int *)&search[5].field_0x6c;
      pcVar27 = search[2].type;
      uStack_450 = (ulong)(uVar38 & 1);
      puVar31 = *(undefined8 **)(pcVar27 + uStack_450 * 8);
      puStack_480 = puVar31;
      if (0 < iVar39) {
        pdStack_468 = (dict2pid_t *)CONCAT44(pdStack_468._4_4_,iVar19);
        ppVar7 = search->pls;
        pdVar40 = search[1].dict;
        iVar19 = 0;
        ppStack_458 = ppVar29;
        do {
          if (((int)uVar43 <= *(int *)((long)&pdVar40[1].mdef + 4)) &&
             ((int)ppVar29 < *(int *)&pdVar40[1].field_0x4)) {
            *(uint *)((long)&pdVar40[1].mdef + 4) = uVar38;
            iVar52 = *(int *)((long)&search[6].pls + 4) + pdVar40->startwid;
            if ((ppVar7 != (ps_search_t *)0x0) || (iVar51 < iVar52)) {
              for (phVar41 = (hmm_t *)pdVar40[1].ht; phVar41 != (hmm_t *)0x0;
                  phVar41 = *(hmm_t **)phVar41[1].score) {
                if (ppVar7 == (ps_search_t *)0x0) {
                  iVar44 = 0;
                }
                else {
                  iVar44 = *(int *)((long)&(ppVar7[1].acmod)->config + (long)phVar41[1].score[2] * 4
                                   );
                }
                if ((iVar51 < iVar44 + iVar52) &&
                   ((phVar41->frame < (int)uVar43 || (phVar41->score[0] < iVar52)))) {
                  hmm_enter(phVar41,iVar52,pdVar40->finishwid,uVar38);
                  *puStack_480 = phVar41;
                  puStack_480 = puStack_480 + 1;
                }
              }
            }
            ppVar29 = ppStack_458;
            if (((ppVar7 != (ps_search_t *)0x0) || ((int)pdStack_468 < iVar52)) &&
               (uVar24 = pdVar40[1].max_words, -1 < (int)uVar24)) {
              lVar37 = *(long *)&search[1].start_wid;
              do {
                uVar33 = (ulong)uVar24;
                if (ppVar7 == (ps_search_t *)0x0) {
                  iVar44 = 0;
                }
                else {
                  pdVar8 = search->dict->word;
                  iVar44 = *(int *)((long)&(ppVar7[1].acmod)->config +
                                   (long)pdVar8[uVar33].ciphone[(long)pdVar8[uVar33].pronlen + -1] *
                                   4);
                }
                if ((int)pdStack_468 < iVar44 + iVar52) {
                  paVar60 = search[2].acmod;
                  lVar48 = (long)*(int *)&search[2].dict;
                  *(int *)&search[2].dict = *(int *)&search[2].dict + 1;
                  *(uint *)(&paVar60->config + lVar48 * 2) = uVar24;
                  *(int *)((long)&paVar60->config + lVar48 * 0x10 + 4) =
                       iVar52 - *(int *)&search[6].pls;
                  *(s3wid_t *)(&paVar60->lmath + lVar48 * 2) = pdVar40->finishwid;
                }
                uVar24 = *(uint *)(lVar37 + uVar33 * 4);
              } while (-1 < (int)uVar24);
            }
          }
          iVar19 = iVar19 + 1;
          pdVar40 = (dict_t *)&pdVar40[1].startwid;
        } while (iVar19 < *(int *)((long)&search[1].d2p + 4));
        pcVar27 = search[2].type;
        puVar31 = *(undefined8 **)(pcVar27 + uStack_450 * 8);
        iVar19 = *(int *)&search[3].last_link;
        ppVar29 = (ps_searchfuncs_t *)(ulong)(uint)(search[5].start_wid + iVar19);
        iVar51 = search[5].silence_wid + iVar19;
        iVar19 = iVar19 + *(int *)&search[5].field_0x6c;
      }
      iVar52 = (int)((ulong)((long)puStack_480 - (long)puVar31) >> 3);
      *(int *)((long)&search[2].name + uStack_450 * 4) = iVar52;
      uStack_440 = (ulong)(uVar43 & 1);
      puStack_480 = puVar31 + iVar52;
      uVar24 = *(uint *)((long)&search[2].name + uStack_440 * 4);
      if (0 < (int)uVar24) {
        puVar31 = *(undefined8 **)(pcVar27 + uStack_440 * 8);
        ppVar7 = search->pls;
        pdStack_468 = (dict2pid_t *)CONCAT44(pdStack_468._4_4_,iVar19);
        ppStack_458 = ppVar29;
        do {
          ppStack_460 = (ps_searchfuncs_t *)(ulong)uVar24;
          phVar41 = (hmm_t *)*puVar31;
          uVar24 = phVar41->frame;
          if ((int)uVar24 < (int)uVar43) {
            __assert_fail("hmm_frame(&hmm->hmm) >= frame_idx",
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                          ,0x335,"void prune_nonroot_chan(ngram_search_t *, int)");
          }
          if ((int)ppVar29 < phVar41->bestscore) {
            if (uVar24 != uVar38) {
              phVar41->frame = uVar38;
              *puStack_480 = phVar41;
              puStack_480 = puStack_480 + 1;
            }
            iVar19 = *(int *)((long)&search[6].pls + 4) + phVar41->out_score;
            if ((ppVar7 != (ps_search_t *)0x0) || (iVar51 < iVar19)) {
              for (phVar56 = (hmm_t *)phVar41[1].ctx; phVar56 != (hmm_t *)0x0;
                  phVar56 = *(hmm_t **)phVar56[1].score) {
                if (ppVar7 == (ps_search_t *)0x0) {
                  iVar52 = 0;
                }
                else {
                  iVar52 = *(int *)((long)&(ppVar7[1].acmod)->config + (long)phVar56[1].score[2] * 4
                                   );
                }
                if ((iVar51 < iVar52 + iVar19) &&
                   ((phVar56->frame < (int)uVar43 || (phVar56->score[0] < iVar19)))) {
                  if (phVar56->frame != uVar38) {
                    *puStack_480 = phVar56;
                    puStack_480 = puStack_480 + 1;
                  }
                  hmm_enter(phVar56,iVar19,phVar41->out_history,uVar38);
                }
              }
            }
            ppVar29 = ppStack_458;
            if (((ppVar7 != (ps_search_t *)0x0) || ((int)pdStack_468 < iVar19)) &&
               (uVar24 = phVar41[1].score[3], -1 < (int)uVar24)) {
              lVar37 = *(long *)&search[1].start_wid;
              do {
                uVar33 = (ulong)uVar24;
                if (ppVar7 == (ps_search_t *)0x0) {
                  iVar52 = 0;
                }
                else {
                  pdVar8 = search->dict->word;
                  iVar52 = *(int *)((long)&(ppVar7[1].acmod)->config +
                                   (long)pdVar8[uVar33].ciphone[(long)pdVar8[uVar33].pronlen + -1] *
                                   4);
                }
                if ((int)pdStack_468 < iVar52 + iVar19) {
                  paVar60 = search[2].acmod;
                  lVar48 = (long)*(int *)&search[2].dict;
                  *(int *)&search[2].dict = *(int *)&search[2].dict + 1;
                  *(uint *)(&paVar60->config + lVar48 * 2) = uVar24;
                  *(int *)((long)&paVar60->config + lVar48 * 0x10 + 4) =
                       iVar19 - *(int *)&search[6].pls;
                  *(int32 *)(&paVar60->lmath + lVar48 * 2) = phVar41->out_history;
                }
                uVar24 = *(uint *)(lVar37 + uVar33 * 4);
              } while (-1 < (int)uVar24);
            }
          }
          else if (uVar24 != uVar38) {
            hmm_clear(phVar41);
          }
          puVar31 = puVar31 + 1;
          uVar24 = (int)ppStack_460 - 1;
        } while (1 < (int)ppStack_460);
        puVar31 = *(undefined8 **)(search[2].type + uStack_450 * 8);
      }
      *(int *)((long)&search[2].name + uStack_450 * 4) =
           (int)((ulong)((long)puStack_480 - (long)puVar31) >> 3);
      ppStack_460 = (&(search[2].pls)->vt)[uStack_450];
      iVar19 = *(int *)&search[2].dict;
      *(int *)&search[4].type = *(int *)&search[4].type + iVar19;
      if (0 < iVar19) {
        paVar60 = search[2].acmod;
        iVar19 = 0;
        uVar24 = 0;
        do {
          if ((long)*(int *)&paVar60->lmath != -1) {
            pbVar58 = (bptbl_t *)((long)*(int *)&paVar60->lmath * 0x24 + *(long *)&search[2].post);
            iVar22 = ngram_search_exit_score
                               ((ngram_search_t *)search,pbVar58,
                                (int)*search->dict->word[*(int *)&paVar60->config].ciphone);
            if (iVar22 < -0x1fffffff) {
              __assert_fail("start_score BETTER_THAN WORST_SCORE",
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                            ,0x392,"void last_phone_transition(ngram_search_t *, int)");
            }
            piVar55 = (int *)((long)&paVar60->config + 4);
            *piVar55 = *piVar55 - iVar22;
            pdVar32 = search[2].d2p;
            lVar37 = (long)*(int *)&paVar60->config;
            iVar51 = pbVar58->frame + 1;
            if ((&pdVar32->refcount)[lVar37 * 3] != iVar51) {
              if (0 < (int)uVar24) {
                ppVar28 = search[2].dag;
                uVar33 = 0;
                do {
                  if ((&ppVar28->refcount)[uVar33 * 2] == pbVar58->frame) {
                    *(undefined4 *)((long)&paVar60->lmath + 4) =
                         *(undefined4 *)(&ppVar28->field_0x4 + uVar33 * 8);
                    goto LAB_0013eafb;
                  }
                  uVar33 = uVar33 + 1;
                } while (uVar24 != uVar33);
              }
              iVar51 = *(int *)&search[2].hyp_str;
              if (iVar51 <= (int)uVar24) {
                if (iVar51 == 0) {
                  ppVar28 = (ps_lattice_t *)
                            __ckd_calloc__(0x20,8,
                                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                                           ,0x3ab);
                  search[2].dag = ppVar28;
                  *(undefined4 *)&search[2].hyp_str = 0x20;
                }
                else {
                  *(int *)&search[2].hyp_str = iVar51 + 0x20;
                  ppVar28 = (ps_lattice_t *)
                            __ckd_realloc__(search[2].dag,(long)iVar51 * 8 + 0x100,
                                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                                            ,0x3b2);
                  search[2].dag = ppVar28;
                  err_msg(ERR_INFO,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                          ,0x3b4,"cand_sf[] increased to %d entries\n",
                          (ulong)*(uint *)&search[2].hyp_str);
                }
              }
              *(undefined4 *)((long)&paVar60->lmath + 4) = 0xffffffff;
              iVar51 = pbVar58->frame;
              ppVar28 = search[2].dag;
              uVar33 = (ulong)(int)uVar24;
              uVar24 = uVar24 + 1;
              (&ppVar28->refcount)[uVar33 * 2] = iVar51;
              pdVar32 = search[2].d2p;
              lVar37 = (long)*(int *)&paVar60->config;
              iVar51 = iVar51 + 1;
LAB_0013eafb:
              *(int *)(&ppVar28->field_0x4 + uVar33 * 8) = iVar19;
              *(undefined4 *)(&pdVar32->field_0x4 + lVar37 * 0xc) = 0xe0000000;
              (&pdVar32->refcount)[lVar37 * 3] = iVar51;
            }
          }
          iVar19 = iVar19 + 1;
          paVar60 = (acmod_t *)&paVar60->strings;
          iVar51 = *(int *)&search[2].dict;
        } while (iVar19 < iVar51);
        if (0 < (int)uVar24) {
          uVar33 = 0;
          do {
            lVar37 = (long)(&(search[2].dag)->refcount)[uVar33 * 2];
            iVar19 = *(int *)(search[3].name + lVar37 * 4);
            iVar51 = *(int *)(search[3].name + lVar37 * 4 + 4);
            pdStack_468 = (dict2pid_t *)uVar33;
            if (iVar19 < iVar51) {
              pbVar58 = (bptbl_t *)((long)iVar19 * 0x24 + *(long *)&search[2].post);
              do {
                if (pbVar58->valid != '\0') {
                  uVar21 = *(uint *)(&(search[2].dag)->field_0x4 + (long)pdStack_468 * 8);
                  while (-1 < (int)uVar21) {
                    pppVar1 = &(search[2].acmod)->config + (ulong)uVar21 * 2;
                    iVar22 = ngram_search_exit_score
                                       ((ngram_search_t *)search,pbVar58,
                                        (int)*search->dict->word
                                              [*(int *)(&(search[2].acmod)->config +
                                                       (ulong)uVar21 * 2)].ciphone);
                    if (-0x20000000 < iVar22) {
                      iVar52 = dict_filler_word(search->dict,*(s3wid_t *)pppVar1);
                      if (iVar52 != 0) {
                        __assert_fail("!dict_filler_word(ps_search_dict(ngs), candp->wid)",
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                                      ,0x3d5,"void last_phone_transition(ngram_search_t *, int)");
                      }
                      iVar20 = ngram_tg_score((ngram_model_t *)search[1].vt,
                                              search->dict->word[*(int *)pppVar1].basewid,
                                              pbVar58->real_wid,pbVar58->prev_real_wid,aiStack_438);
                      iVar22 = iVar22 + (iVar20 >> 10);
                    }
                    pdVar32 = search[2].d2p;
                    lVar37 = (long)*(int *)pppVar1;
                    if (*(int *)(&pdVar32->field_0x4 + lVar37 * 0xc) < iVar22) {
                      *(int32 *)(&pdVar32->field_0x4 + lVar37 * 0xc) = iVar22;
                      *(int *)((long)&pdVar32->mdef + lVar37 * 0xc) = iVar19;
                    }
                    uVar21 = *(uint *)((long)pppVar1 + 0xc);
                  }
                }
                iVar19 = iVar19 + 1;
                pbVar58 = pbVar58 + 1;
              } while (iVar19 != iVar51);
            }
            uVar33 = (long)pdStack_468 + 1;
          } while (uVar33 != uVar24);
          iVar51 = *(int *)&search[2].dict;
        }
        if (0 < iVar51) {
          paVar60 = search[2].acmod;
          iVar19 = *(int *)((long)&search[3].last_link + 4);
          pdVar32 = search[2].d2p;
          paVar35 = paVar60;
          iVar52 = iVar51;
          do {
            iVar44 = *(int *)&paVar35->config;
            iVar39 = *(int *)((long)&paVar35->config + 4) +
                     *(int *)(&pdVar32->field_0x4 + (long)iVar44 * 0xc);
            *(int *)((long)&paVar35->config + 4) = iVar39;
            *(undefined4 *)&paVar35->lmath =
                 *(undefined4 *)((long)&pdVar32->mdef + (long)iVar44 * 0xc);
            if (iVar39 <= iVar19) {
              iVar39 = iVar19;
            }
            iVar19 = iVar39;
            paVar35 = (acmod_t *)&paVar35->strings;
            iVar52 = iVar52 + -1;
          } while (iVar52 != 0);
          *(int *)((long)&search[3].last_link + 4) = iVar19;
          iVar52 = *(int *)&search[6].vt;
          do {
            if (iVar19 + iVar52 < *(int *)((long)&paVar60->config + 4)) {
              uVar24 = *(uint *)&paVar60->config;
              ngram_search_alloc_all_rc((ngram_search_t *)search,uVar24);
              phVar41 = (hmm_t *)(&(search[1].last_link)->from)[(int)uVar24];
              if (phVar41 != (hmm_t *)0x0) {
                iVar44 = 0;
                pdStack_468 = (dict2pid_t *)(long)(int)uVar24;
                do {
                  if ((phVar41->frame < (int)uVar43) ||
                     (phVar41->score[0] < *(int *)((long)&paVar60->config + 4))) {
                    if (phVar41->frame == uVar38) {
                      __assert_fail("hmm_frame(&hmm->hmm) != nf",
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                                    ,0x3fc,"void last_phone_transition(ngram_search_t *, int)");
                    }
                    hmm_enter(phVar41,*(int32 *)((long)&paVar60->config + 4),
                              *(int32 *)&paVar60->lmath,uVar38);
                    iVar44 = iVar44 + 1;
                  }
                  phVar41 = (hmm_t *)phVar41[1].ctx;
                } while (phVar41 != (hmm_t *)0x0);
                if (0 < iVar44) {
                  uVar21 = uVar24 + 0x1f;
                  if (-1 < (int)uVar24) {
                    uVar21 = uVar24;
                  }
                  lVar37 = *(long *)&search[1].post;
                  if ((*(uint *)(lVar37 + (long)((int)uVar21 >> 5) * 4) >> (uVar24 & 0x1f) & 1) != 0
                     ) {
                    __assert_fail("bitvec_is_clear(ngs->word_active, w)",
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                                  ,0x403,"void last_phone_transition(ngram_search_t *, int)");
                  }
                  if (search->dict->word[(long)pdStack_468].pronlen == 1) {
                    __assert_fail("!dict_is_single_phone(ps_search_dict(ngs), w)",
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                                  ,0x404,"void last_phone_transition(ngram_search_t *, int)");
                  }
                  *(uint *)&ppStack_460->start = uVar24;
                  ppStack_460 = (ps_searchfuncs_t *)((long)&ppStack_460->start + 4);
                  puVar34 = (uint *)(lVar37 + (long)((int)uVar21 >> 5) * 4);
                  *puVar34 = *puVar34 | (uint)(1L << ((byte)uVar24 & 0x1f));
                }
              }
            }
            paVar60 = (acmod_t *)&paVar60->strings;
            bVar14 = 1 < iVar51;
            iVar51 = iVar51 + -1;
          } while (bVar14);
        }
      }
      ppVar7 = search[2].pls;
      ppVar29 = (&ppVar7->vt)[uStack_450];
      iVar52 = (int)((ulong)((long)ppStack_460 - (long)ppVar29) >> 2);
      *(int *)((long)&search[2].config + uStack_450 * 4) = iVar52;
      iVar19 = *(int *)((long)&search[3].last_link + 4);
      iVar51 = search[5].finish_wid + iVar19;
      iVar19 = iVar19 + *(int *)&search[6].vt;
      puStack_448 = (uint *)((long)&ppVar29->start + (long)iVar52 * 4);
      uVar24 = *(uint *)((long)&search[2].config + uStack_440 * 4);
      pdStack_468 = (dict2pid_t *)CONCAT44(pdStack_468._4_4_,iVar19);
      if (0 < (int)uVar24) {
        ppVar29 = (&ppVar7->vt)[uStack_440];
        do {
          uVar21 = *(uint *)&ppVar29->start;
          uVar33 = (ulong)(int)uVar21;
          phVar41 = (hmm_t *)(&(search[1].last_link)->from)[uVar33];
          ppVar49 = (ps_searchfuncs_t *)(ulong)uVar24;
          if (phVar41 != (hmm_t *)0x0) {
            phVar56 = (hmm_t *)(&(search[1].last_link)->from + uVar33);
            iVar52 = 0;
            ppStack_460 = (ps_searchfuncs_t *)(ulong)uVar24;
            ppStack_458 = ppVar29;
            uStack_440 = uVar33;
            do {
              if (phVar41->frame < (int)uVar43) {
                __assert_fail("hmm_frame(&hmm->hmm) >= frame_idx",
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                              ,0x428,"void prune_word_chan(ngram_search_t *, int)");
              }
              phVar18 = phVar41 + 1;
              phVar9 = (hmm_t *)phVar41[1].ctx;
              if (iVar19 < phVar41->bestscore) {
                phVar41->frame = uVar38;
                iVar52 = iVar52 + 1;
                if (iVar51 < phVar41->out_score) {
                  ngram_search_save_bp
                            ((ngram_search_t *)search,uVar43,uVar21,phVar41->out_score,
                             phVar41->out_history,phVar41[1].score[3]);
                  iVar19 = (int)pdStack_468;
                }
              }
              else if (phVar41->frame != uVar38) {
                hmm_deinit(phVar41);
                __listelem_free__((listelem_alloc_t *)search[1].pls,phVar41,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                                  ,0x43f);
                phVar56->ctx = (hmm_context_t *)phVar9;
                phVar18 = phVar56;
                iVar19 = (int)pdStack_468;
              }
              phVar56 = phVar18;
              phVar41 = phVar9;
            } while (phVar9 != (hmm_t *)0x0);
            ppVar49 = ppStack_460;
            ppVar29 = ppStack_458;
            if (0 < iVar52) {
              uVar24 = uVar21 + 0x1f;
              if (-1 < (int)uVar21) {
                uVar24 = uVar21;
              }
              lVar37 = *(long *)&search[1].post;
              if ((*(uint *)(lVar37 + (long)((int)uVar24 >> 5) * 4) >> (uVar21 & 0x1f) & 1) == 0) {
                if (search->dict->word[uStack_440].pronlen == 1) {
                  __assert_fail("!dict_is_single_phone(ps_search_dict(ngs), w)",
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                                ,0x444,"void prune_word_chan(ngram_search_t *, int)");
                }
                *puStack_448 = uVar21;
                puStack_448 = puStack_448 + 1;
                puVar34 = (uint *)(lVar37 + (long)((int)uVar24 >> 5) * 4);
                *puVar34 = *puVar34 | (uint)(1L << ((byte)uVar21 & 0x1f));
              }
            }
          }
          ppVar29 = (ps_searchfuncs_t *)((long)&ppVar29->start + 4);
          uVar24 = (int)ppVar49 - 1;
        } while (1 < (int)ppVar49);
        ppVar29 = (&(search[2].pls)->vt)[uStack_450];
      }
      *(int *)((long)&search[2].config + uStack_450 * 4) =
           (int)((ulong)((long)puStack_448 - (long)ppVar29) >> 2);
      iVar52 = *(int *)&search[2].vt;
      if (0 < iVar52) {
        lVar37 = 0;
        do {
          iVar44 = *(int *)(*(long *)&search[1].finish_wid + lVar37 * 4);
          ppVar10 = (&(search[1].last_link)->from)[iVar44];
          if (((int)uVar43 <= ppVar10[1].wid) && (iVar19 < *(int *)((long)&ppVar10->next + 4))) {
            ppVar10[1].wid = uVar38;
            if (iVar51 < *(int32 *)&ppVar10->entries) {
              ngram_search_save_bp
                        ((ngram_search_t *)search,uVar43,iVar44,*(int32 *)&ppVar10->entries,
                         *(int32 *)((long)&ppVar10->entries + 4),0);
              iVar52 = *(int *)&search[2].vt;
              iVar19 = (int)pdStack_468;
            }
          }
          lVar37 = lVar37 + 1;
        } while (lVar37 < iVar52);
      }
      if ((*(int *)&search[6].config != -1) && (*(int *)&search[6].config != search->n_words)) {
        lVar37 = (long)(int)uStack_46c;
        lVar48 = (long)*(int *)(search[3].name + lVar37 * 4);
        iVar19 = search[2].start_wid;
        iVar51 = 0;
        if (*(int *)(search[3].name + lVar37 * 4) < iVar19) {
          lVar42 = lVar48 * 0x24;
          lVar50 = 0;
          iVar52 = -0x80000000;
          iVar51 = 0;
          do {
            lVar62 = *(long *)&search[2].post;
            iVar19 = dict_filler_word(search->dict,*(s3wid_t *)(lVar62 + 8 + lVar42));
            if (iVar19 != 0) {
              iVar19 = *(int *)(lVar62 + 0x10 + lVar42);
              if (iVar52 < iVar19) {
                lVar50 = lVar62 + lVar42;
                iVar52 = iVar19;
              }
              *(undefined1 *)(lVar62 + 4 + lVar42) = 0;
              iVar51 = iVar51 + 1;
            }
            lVar48 = lVar48 + 1;
            iVar19 = search[2].start_wid;
            lVar42 = lVar42 + 0x24;
          } while (lVar48 < iVar19);
          if (lVar50 != 0) {
            *(undefined1 *)(lVar50 + 4) = 1;
            iVar51 = iVar51 + -1;
          }
        }
        iVar52 = *(int *)(search[3].name + lVar37 * 4);
        iVar51 = (iVar19 - iVar52) - iVar51;
        iVar44 = *(int *)&search[6].config;
        if (iVar44 < iVar51) {
          if (iVar19 <= iVar52) {
LAB_0013fa05:
            err_msg(ERR_FATAL,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                    ,0x4d3,"PANIC: No worst BPtable entry remaining\n");
            exit(1);
          }
          lVar37 = *(long *)&search[2].post;
          do {
            iVar39 = 0x7fffffff;
            lVar48 = 0;
            lVar42 = (long)iVar52 * 0x24 + lVar37;
            lVar50 = (long)iVar19 - (long)iVar52;
            do {
              if ((*(char *)(lVar42 + 4) != '\0') && (*(int *)(lVar42 + 0x10) < iVar39)) {
                lVar48 = lVar42;
                iVar39 = *(int *)(lVar42 + 0x10);
              }
              lVar42 = lVar42 + 0x24;
              lVar50 = lVar50 + -1;
            } while (lVar50 != 0);
            if (lVar48 == 0) goto LAB_0013fa05;
            *(undefined1 *)(lVar48 + 4) = 0;
            iVar51 = iVar51 + -1;
          } while (iVar44 < iVar51);
        }
      }
      uVar43 = uStack_46c;
      auVar17 = _DAT_00155b70;
      auVar16 = _DAT_00154950;
      auVar15 = _DAT_00154940;
      lVar37 = (long)(int)uStack_46c;
      pdVar40 = search->dict;
      pdStack_468 = search->d2p;
      pbVar11 = search->acmod->mdef;
      iVar19 = pbVar11->n_ciphone;
      lVar48 = (long)iVar19;
      if (0 < lVar48) {
        lVar42 = lVar48 + -1;
        auVar63._8_4_ = (int)lVar42;
        auVar63._0_8_ = lVar42;
        auVar63._12_4_ = (int)((ulong)lVar42 >> 0x20);
        puVar36 = (undefined4 *)((long)search[2].last_link + lVar48 * 0xc + -0xc);
        uVar33 = 0;
        auVar63 = auVar63 ^ _DAT_00154950;
        do {
          auVar64._8_4_ = (int)uVar33;
          auVar64._0_8_ = uVar33;
          auVar64._12_4_ = (int)(uVar33 >> 0x20);
          auVar65 = (auVar64 | auVar15) ^ auVar16;
          iVar51 = auVar63._4_4_;
          if ((bool)(~(auVar65._4_4_ == iVar51 && auVar63._0_4_ < auVar65._0_4_ ||
                      iVar51 < auVar65._4_4_) & 1)) {
            *puVar36 = 0xe0000000;
          }
          if ((auVar65._12_4_ != auVar63._12_4_ || auVar65._8_4_ <= auVar63._8_4_) &&
              auVar65._12_4_ <= auVar63._12_4_) {
            puVar36[-3] = 0xe0000000;
          }
          auVar64 = (auVar64 | auVar17) ^ auVar16;
          iVar52 = auVar64._4_4_;
          if (iVar52 <= iVar51 && (iVar52 != iVar51 || auVar64._0_4_ <= auVar63._0_4_)) {
            puVar36[-6] = 0xe0000000;
            puVar36[-9] = 0xe0000000;
          }
          uVar33 = uVar33 + 4;
          puVar36 = puVar36 + -0xc;
        } while ((iVar19 + 3U & 0xfffffffc) != uVar33);
      }
      lVar48 = (long)*(int *)(search[3].name + lVar37 * 4);
      if (*(int *)(search[3].name + lVar37 * 4) < search[2].start_wid) {
        ppVar7 = search->pls;
        lVar42 = *(long *)&search[2].post;
        ppVar12 = search[3].pls;
        iVar19 = 0;
        do {
          *(undefined4 *)((long)&ppVar12->vt + (long)*(int *)(lVar42 + 8 + lVar48 * 0x24) * 4) =
               0xffffffff;
          if (*(int *)(lVar42 + 8 + lVar48 * 0x24) != search->finish_wid) {
            lVar50 = lVar42 + lVar48 * 0x24;
            iVar19 = iVar19 + 1;
            if ((long)*(short *)(lVar50 + 0x22) == -1) {
              iVar51 = pbVar11->n_ciphone;
              if (0 < (long)iVar51) {
                iVar52 = *(int *)(lVar50 + 0x10);
                ppVar61 = search[2].last_link;
                lVar62 = 0;
                do {
                  if (*(int *)((long)&ppVar61->from + lVar62) < iVar52) {
                    *(int *)((long)&ppVar61->from + lVar62) = iVar52;
                    *(int *)((long)&ppVar61->from + lVar62 + 4) = (int)lVar48;
                    *(int *)((long)&ppVar61->to + lVar62) = (int)*(short *)(lVar50 + 0x20);
                  }
                  lVar62 = lVar62 + 0xc;
                } while ((long)iVar51 * 0xc != lVar62);
              }
            }
            else {
              iVar51 = pbVar11->n_ciphone;
              if (0 < (long)iVar51) {
                iVar52 = *(int *)(lVar50 + 0x14);
                lVar62 = *(long *)&search[2].finish_wid;
                sVar3 = *(short *)(lVar50 + 0x20);
                psVar13 = pdStack_468->rssid[(int)sVar3][*(short *)(lVar50 + 0x22)].cimap;
                ppVar61 = search[2].last_link;
                lVar50 = 0;
                do {
                  iVar44 = *(int *)((long)iVar52 * 4 + lVar62 + (long)psVar13[lVar50] * 4);
                  if (*(int *)&ppVar61->from < iVar44) {
                    *(int *)&ppVar61->from = iVar44;
                    *(int *)((long)&ppVar61->from + 4) = (int)lVar48;
                    *(int *)&ppVar61->to = (int)sVar3;
                  }
                  lVar50 = lVar50 + 1;
                  ppVar61 = (ps_latlink_t *)((long)&ppVar61->to + 4);
                } while (iVar51 != lVar50);
              }
            }
          }
          lVar48 = lVar48 + 1;
        } while (lVar48 < search[2].start_wid);
        if (iVar19 != 0) {
          ppStack_460 = (ps_searchfuncs_t *)CONCAT44(ppStack_460._4_4_,uStack_46c + 1);
          iVar19 = *(int *)((long)&search[1].d2p + 4);
          iVar51 = search[5].start_wid + *(int *)&search[3].last_link;
          if (0 < iVar19) {
            phVar41 = (hmm_t *)search[1].dict;
            iVar19 = iVar19 + 1;
            do {
              lVar48 = (long)(short)phVar41[1].score[2];
              if (ppVar7 == (ps_search_t *)0x0) {
                iVar52 = 0;
              }
              else {
                iVar52 = *(int *)((long)&(ppVar7[1].acmod)->config + lVar48 * 4);
              }
              ppVar61 = search[2].last_link;
              iVar44 = *(int *)&search[6].pls + *(int *)((long)&ppVar61->from + lVar48 * 0xc) +
                       *(int *)((long)&search[6].pls + 4);
              if ((iVar51 < iVar52 + iVar44) &&
                 ((phVar41->frame < (int)uVar43 || (phVar41->score[0] < iVar44)))) {
                hmm_enter(phVar41,iVar44,*(int32 *)((long)&ppVar61->from + lVar48 * 0xc + 4),
                          (int)ppStack_460);
                sVar4 = pdStack_468->ldiph_lc[(short)phVar41[1].score[2]]
                        [*(short *)((long)phVar41[1].score + 10)]
                        [*(int *)((long)&ppVar61->to + lVar48 * 0xc)];
                phVar41->senid[0] = sVar4;
                if (sVar4 == 0xffff) {
                  __assert_fail("hmm_mpx_ssid(&rhmm->hmm, 0) != BAD_SSID",
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                                ,0x52e,"void word_transition(ngram_search_t *, int)");
                }
              }
              phVar41 = (hmm_t *)(phVar41[1].score + 4);
              iVar19 = iVar19 + -1;
            } while (1 < iVar19);
          }
          uVar33 = (ulong)*(int *)((long)&search[2].vt + 4);
          if (0 < (long)uVar33) {
            lVar48 = *(long *)&search[1].finish_wid;
            pdVar32 = search[2].d2p;
            uVar57 = 0;
            do {
              *(undefined4 *)(&pdVar32->field_0x4 + (long)*(int *)(lVar48 + uVar57 * 4) * 0xc) =
                   0x80000000;
              uVar57 = uVar57 + 1;
            } while (uVar33 != uVar57);
          }
          lVar48 = (long)*(int *)(search[3].name + lVar37 * 4);
          iVar19 = search[2].start_wid;
          if (*(int *)(search[3].name + lVar37 * 4) < iVar19) {
            ppStack_458 = (ps_searchfuncs_t *)CONCAT44(ppStack_458._4_4_,iVar51);
            do {
              if (0 < (int)uVar33 && *(char *)(*(long *)&search[2].post + 4 + lVar48 * 0x24) != '\0'
                 ) {
                pbVar58 = (bptbl_t *)(*(long *)&search[2].post + lVar48 * 0x24);
                lVar37 = 0;
                do {
                  lVar42 = (long)*(int *)(*(long *)&search[1].finish_wid + lVar37 * 4);
                  iVar22 = ngram_search_exit_score
                                     ((ngram_search_t *)search,pbVar58,
                                      (int)*pdVar40->word[lVar42].ciphone);
                  iVar19 = -0x20000000;
                  if (iVar22 != -0x20000000) {
                    iVar20 = ngram_tg_score((ngram_model_t *)search[1].vt,
                                            pdVar40->word[lVar42].basewid,pbVar58->real_wid,
                                            pbVar58->prev_real_wid,aiStack_438);
                    iVar19 = (iVar20 >> 10) + iVar22;
                  }
                  pdVar32 = search[2].d2p;
                  if (*(int *)(&pdVar32->field_0x4 + lVar42 * 0xc) < iVar19) {
                    *(int *)(&pdVar32->field_0x4 + lVar42 * 0xc) = iVar19;
                    *(int *)((long)&pdVar32->mdef + lVar42 * 0xc) = (int)lVar48;
                  }
                  lVar37 = lVar37 + 1;
                  uVar33 = (ulong)*(int *)((long)&search[2].vt + 4);
                } while (lVar37 < (long)uVar33);
                iVar19 = search[2].start_wid;
                iVar51 = (int)ppStack_458;
              }
              lVar48 = lVar48 + 1;
            } while (lVar48 < iVar19);
          }
          if (0 < (int)uVar33) {
            lVar37 = 0;
            do {
              iVar19 = *(int *)(*(long *)&search[1].finish_wid + lVar37 * 4);
              lVar48 = (long)iVar19;
              if (iVar19 != search->dict->startwid) {
                phVar41 = (hmm_t *)(&(search[1].last_link)->from)[lVar48];
                if (ppVar7 == (ps_search_t *)0x0) {
                  iVar19 = 0;
                }
                else {
                  iVar19 = *(int *)((long)&(ppVar7[1].acmod)->config +
                                   (long)(short)phVar41[1].score[2] * 4);
                }
                iVar52 = *(int *)((long)&search[6].pls + 4) +
                         *(int *)(&(search[2].d2p)->field_0x4 + lVar48 * 0xc);
                if (iVar51 < iVar19 + iVar52) {
                  lVar42 = *(long *)&search[2].post;
                  iVar19 = *(int *)((long)&(search[2].d2p)->mdef + lVar48 * 0xc);
                  if ((phVar41->frame < (int)uVar43) || (phVar41->score[0] < iVar52)) {
                    hmm_enter(phVar41,iVar52,iVar19,(int)ppStack_460);
                    iVar19 = *(int *)(lVar42 + 8 + (long)iVar19 * 0x24);
                    uVar2 = pdStack_468->ldiph_lc[(short)phVar41[1].score[2]]
                            [*(short *)((long)phVar41[1].score + 10)]
                            [pdVar40->word[iVar19].ciphone[(long)pdVar40->word[iVar19].pronlen + -1]
                            ];
                    phVar41->senid[0] = uVar2;
                    if (uVar2 == 0xffff) {
                      __assert_fail("hmm_mpx_ssid(&rhmm->hmm, 0) != BAD_SSID",
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                                    ,0x56c,"void word_transition(ngram_search_t *, int)");
                    }
                    uVar33 = (ulong)*(uint *)((long)&search[2].vt + 4);
                  }
                }
              }
              lVar37 = lVar37 + 1;
            } while (lVar37 < (int)uVar33);
          }
          lVar37 = (long)search->acmod->mdef->sil;
          phVar41 = (hmm_t *)(&(search[1].last_link)->from)[search->silence_wid];
          iVar19 = *(int *)&search[6].name +
                   *(int *)((long)&(search[2].last_link)->from + lVar37 * 0xc) +
                   *(int *)((long)&search[6].pls + 4);
          if (ppVar7 == (ps_search_t *)0x0) {
            iVar52 = 0;
          }
          else {
            iVar52 = *(int *)((long)&(ppVar7[1].acmod)->config +
                             (long)(short)phVar41[1].score[2] * 4);
          }
          piVar55 = (int *)((long)&(search[2].last_link)->from + lVar37 * 0xc);
          if ((iVar51 < iVar52 + iVar19) &&
             ((phVar41->frame < (int)uVar43 || (phVar41->score[0] < iVar19)))) {
            hmm_enter(phVar41,iVar19,piVar55[1],(int)ppStack_460);
          }
          iVar19 = pdVar40->filler_start;
          iVar52 = pdVar40->filler_end;
          if (iVar19 <= iVar52) {
            lVar37 = (long)iVar19 + -1;
            do {
              if (((iVar19 != search->silence_wid) && (iVar19 != search->dict->startwid)) &&
                 (phVar41 = (hmm_t *)(&(search[1].last_link)->to)[lVar37], phVar41 != (hmm_t *)0x0))
              {
                if (ppVar7 == (ps_search_t *)0x0) {
                  iVar44 = 0;
                }
                else {
                  iVar44 = *(int *)((long)&(ppVar7[1].acmod)->config +
                                   (long)(short)phVar41[1].score[2] * 4);
                }
                iVar39 = *(int *)((long)&search[6].type + 4) + *piVar55 +
                         *(int *)((long)&search[6].pls + 4);
                if ((iVar51 < iVar44 + iVar39) &&
                   ((phVar41->frame < (int)uVar43 || (phVar41->score[0] < iVar39)))) {
                  hmm_enter(phVar41,iVar39,piVar55[1],(int)ppStack_460);
                  iVar52 = pdVar40->filler_end;
                }
              }
              lVar37 = lVar37 + 1;
              iVar19 = iVar19 + 1;
            } while (lVar37 < iVar52);
          }
        }
      }
      uVar43 = uStack_46c;
      iVar19 = *(int *)((long)&search[1].d2p + 4);
      if (0 < iVar19) {
        phVar41 = (hmm_t *)search[1].dict;
        iVar19 = iVar19 + 1;
        do {
          if (phVar41->frame == uVar43) {
            hmm_clear(phVar41);
          }
          phVar41 = (hmm_t *)(phVar41[1].score + 4);
          iVar19 = iVar19 + -1;
        } while (1 < iVar19);
      }
      iVar19 = *(int *)&search[2].vt;
      if (0 < iVar19) {
        lVar37 = 0;
        do {
          phVar41 = (hmm_t *)(&(search[1].last_link)->from)
                             [*(int *)(*(long *)&search[1].finish_wid + lVar37 * 4)];
          if (phVar41->frame == uVar43) {
            hmm_clear(phVar41);
            iVar19 = *(int *)&search[2].vt;
          }
          lVar37 = lVar37 + 1;
        } while (lVar37 < iVar19);
      }
      piVar55 = (int *)((long)&search[3].type + 4);
      *piVar55 = *piVar55 + 1;
      iVar19 = 1;
    }
  }
  return iVar19;
}

Assistant:

static int
ngram_search_step(ps_search_t *search, int frame_idx)
{
    ngram_search_t *ngs = (ngram_search_t *)search;

    if (ngs->fwdtree)
        return ngram_fwdtree_search(ngs, frame_idx);
    else if (ngs->fwdflat)
        return ngram_fwdflat_search(ngs, frame_idx);
    else
        return -1;
}